

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::ReadBuffersResponse::ParseFromArray
          (ReadBuffersResponse *this,void *raw,size_t size)

{
  pointer pRVar1;
  uint64_t uVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  uint64_t *puVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong uVar8;
  uint64_t *end;
  uint uVar9;
  ulong uVar10;
  uint64_t int_value;
  uint64_t payload_length;
  uint64_t preamble;
  uint local_60;
  ushort local_5c;
  uint8_t local_5a;
  ReadBuffersResponse *local_58;
  vector<perfetto::protos::gen::ReadBuffersResponse_Slice,_std::allocator<perfetto::protos::gen::ReadBuffersResponse_Slice>_>
  *local_50;
  bitset<3UL> *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  uint64_t payload_length_1;
  
  local_50 = &this->slices_;
  std::
  vector<perfetto::protos::gen::ReadBuffersResponse_Slice,_std::allocator<perfetto::protos::gen::ReadBuffersResponse_Slice>_>
  ::clear(local_50);
  local_40 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  end = (uint64_t *)(size + (long)raw);
  uVar8 = 0;
  local_58 = this;
  do {
    if (end <= raw) goto switchD_00307ca7_caseD_3;
    preamble = 0;
    if ((long)(char)*raw < 0) {
      puVar5 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&preamble);
      if (puVar5 != (uint64_t *)raw) goto LAB_00307c70;
LAB_00307faf:
      uVar8 = 0;
      uVar6 = 0;
      goto LAB_00307d9d;
    }
    puVar5 = (uint64_t *)((long)raw + 1);
    preamble = (long)(char)*raw;
LAB_00307c70:
    uVar2 = preamble;
    uVar10 = preamble >> 3;
    uVar9 = (uint)uVar10;
    if ((uVar9 == 0) || (end <= puVar5)) goto LAB_00307faf;
    int_value = 0;
    switch((uint)preamble & 7) {
    case 0:
      puVar4 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar5,(uint8_t *)end,&int_value);
      uVar7 = 0;
      uVar6 = 0;
      if (puVar4 == puVar5) goto LAB_00307d9d;
      break;
    case 1:
      puVar4 = puVar5 + 1;
      if (end < puVar4) goto switchD_00307ca7_caseD_3;
      int_value = *puVar5;
LAB_00307cf1:
      uVar7 = 0;
      break;
    case 2:
      puVar3 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar5,(uint8_t *)end,&payload_length)
      ;
      if ((puVar3 == puVar5) || ((ulong)((long)end - (long)puVar3) < payload_length))
      goto switchD_00307ca7_caseD_3;
      puVar4 = (uint64_t *)((long)puVar3 + payload_length);
      uVar7 = payload_length;
      int_value = (uint64_t)puVar3;
      break;
    default:
      goto switchD_00307ca7_caseD_3;
    case 5:
      puVar4 = (uint64_t *)((long)puVar5 + 4);
      if (puVar4 <= end) {
        int_value = (uint64_t)(uint)*puVar5;
        goto LAB_00307cf1;
      }
      goto switchD_00307ca7_caseD_3;
    }
    raw = puVar4;
  } while ((0xffff < uVar9) || (0xfffffff < uVar7));
  uVar8 = uVar7 | (uVar2 & 7) << 0x30 | uVar10 << 0x20;
  uVar6 = int_value;
LAB_00307d9d:
  local_48 = &local_58->_has_field_;
LAB_00307db3:
  do {
    preamble = uVar6;
    local_60 = (uint)uVar8;
    local_5a = (uint8_t)(uVar8 >> 0x30);
    local_5c = (ushort)(uVar8 >> 0x20);
    if (local_5c == 0) {
      return end == (uint64_t *)raw;
    }
    if ((local_5c < 3) &&
       (std::bitset<3UL>::set(local_48,(ulong)((uint)(uVar8 >> 0x20) & 3),true), local_5c == 2)) {
      std::
      vector<perfetto::protos::gen::ReadBuffersResponse_Slice,_std::allocator<perfetto::protos::gen::ReadBuffersResponse_Slice>_>
      ::emplace_back<>(local_50);
      pRVar1 = (local_58->slices_).
               super__Vector_base<perfetto::protos::gen::ReadBuffersResponse_Slice,_std::allocator<perfetto::protos::gen::ReadBuffersResponse_Slice>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (*pRVar1[-1].super_CppMessageObj._vptr_CppMessageObj[4])(pRVar1 + -1,preamble,(ulong)local_60)
      ;
    }
    else {
      protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
                ((Field *)&preamble,local_40);
    }
    do {
      if (end <= raw) {
LAB_00307f8c:
        uVar8 = 0;
        uVar6 = 0;
        goto LAB_00307db3;
      }
      int_value = 0;
      if ((long)(char)*raw < 0) {
        puVar5 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&int_value);
        if (puVar5 == (uint64_t *)raw) goto LAB_00307f8c;
      }
      else {
        puVar5 = (uint64_t *)((long)raw + 1);
        int_value = (long)(char)*raw;
      }
      uVar2 = int_value;
      uVar10 = int_value >> 3;
      uVar9 = (uint)uVar10;
      if ((uVar9 == 0) || (end <= puVar5)) goto LAB_00307f8c;
      payload_length = 0;
      switch((uint)int_value & 7) {
      case 0:
        puVar4 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt
                           ((uint8_t *)puVar5,(uint8_t *)end,&payload_length);
        uVar7 = 0;
        uVar8 = 0;
        uVar6 = 0;
        if (puVar4 == puVar5) goto LAB_00307db3;
        break;
      case 1:
        puVar4 = puVar5 + 1;
        if (end < puVar4) goto switchD_00307e96_caseD_3;
        payload_length = *puVar5;
LAB_00307eee:
        uVar7 = 0;
        break;
      case 2:
        puVar3 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt
                           ((uint8_t *)puVar5,(uint8_t *)end,&payload_length_1);
        if ((puVar3 == puVar5) || ((ulong)((long)end - (long)puVar3) < payload_length_1))
        goto switchD_00307e96_caseD_3;
        puVar4 = (uint64_t *)((long)puVar3 + payload_length_1);
        uVar7 = payload_length_1;
        payload_length = (uint64_t)puVar3;
        break;
      default:
        goto switchD_00307e96_caseD_3;
      case 5:
        puVar4 = (uint64_t *)((long)puVar5 + 4);
        if (puVar4 <= end) {
          payload_length = (uint64_t)(uint)*puVar5;
          goto LAB_00307eee;
        }
        goto switchD_00307e96_caseD_3;
      }
      raw = puVar4;
    } while ((0xffff < uVar9) || (0xfffffff < uVar7));
    uVar8 = uVar7 | (uVar2 & 7) << 0x30 | uVar10 << 0x20;
    uVar6 = payload_length;
  } while( true );
switchD_00307ca7_caseD_3:
  uVar8 = 0;
  uVar6 = 0;
  goto LAB_00307d9d;
switchD_00307e96_caseD_3:
  uVar8 = 0;
  uVar6 = 0;
  goto LAB_00307db3;
}

Assistant:

bool ReadBuffersResponse::ParseFromArray(const void* raw, size_t size) {
  slices_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 2 /* slices */:
        slices_.emplace_back();
        slices_.back().ParseFromArray(field.data(), field.size());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}